

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewFunctionProcessingVisitor.cpp
# Opt level: O0

void __thiscall
NewFunctionProcessingVisitor::Visit(NewFunctionProcessingVisitor *this,WhileStatement *statement)

{
  int iVar1;
  Value *pVVar2;
  reference ppNVar3;
  reference pvVar4;
  int local_2c;
  long local_28;
  size_t index;
  WhileStatement *local_18;
  WhileStatement *statement_local;
  NewFunctionProcessingVisitor *this_local;
  
  this->current_layer_->traverse_index = this->current_layer_->traverse_index + 1;
  local_18 = statement;
  statement_local = (WhileStatement *)this;
  while( true ) {
    pVVar2 = TemplateVisitor<Value_*>::Accept
                       (&this->super_TemplateVisitor<Value_*>,&local_18->expression_->super_Node);
    iVar1 = (*pVVar2->_vptr_Value[2])();
    if (iVar1 == 0) break;
    ppNVar3 = std::vector<NewScopeLayer_*,_std::allocator<NewScopeLayer_*>_>::operator[]
                        (&this->current_layer_->children_,
                         (long)(this->current_layer_->traverse_index + -1));
    this->current_layer_ = *ppNVar3;
    index._4_4_ = 0;
    std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
              (&this->offsets_,(value_type *)((long)&index + 4));
    FrameEmulator::AllocScope(&this->frame_);
    FunctionTable::BeginScope(&this->table_);
    (**(local_18->statement_->super_Node)._vptr_Node)(local_18->statement_,this);
    std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop(&this->offsets_);
    this->current_layer_ = this->current_layer_->parent_;
    FrameEmulator::DeallocScope(&this->frame_);
    FunctionTable::EndScope(&this->table_);
  }
  pvVar4 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top(&this->offsets_);
  local_28 = (long)*pvVar4;
  std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop(&this->offsets_);
  local_2c = (int)local_28 + 1;
  std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push(&this->offsets_,&local_2c);
  return;
}

Assistant:

void NewFunctionProcessingVisitor::Visit(WhileStatement* statement) {
  ++current_layer_->traverse_index;
  while (Accept(statement->expression_)->GetValue()) {
    current_layer_ =
        current_layer_->children_[current_layer_->traverse_index - 1];

    offsets_.push(0);
    frame_.AllocScope();
    table_.BeginScope();

    statement->statement_->Accept(this);

    offsets_.pop();
    current_layer_ = current_layer_->parent_;
    frame_.DeallocScope();
    table_.EndScope();
  }
  size_t index = offsets_.top();
  offsets_.pop();
  offsets_.push(index + 1);
}